

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O2

bool dxil_spv::Converter::entry_point_matches(String *mangled,char *user)

{
  bool bVar1;
  String SStack_38;
  
  bVar1 = is_mangled_entry_point(user);
  if (bVar1) {
    bVar1 = std::operator==(mangled,user);
    return bVar1;
  }
  demangle_entry_point(&SStack_38,mangled);
  bVar1 = std::operator==(&SStack_38,user);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  _M_dispose(&SStack_38);
  return bVar1;
}

Assistant:

bool Converter::entry_point_matches(const String &mangled, const char *user)
{
	if (is_mangled_entry_point(user))
		return mangled == user;
	else
		return demangle_entry_point(mangled) == user;
}